

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::CombinedGeometryUniformLimitCase::iterate
          (CombinedGeometryUniformLimitCase *this)

{
  bool bVar1;
  int iVar2;
  deBool dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *this_00;
  int *piVar6;
  Enum<int,_2UL> EVar7;
  allocator<char> local_511;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  ScopedLogSection local_4c8;
  ScopedLogSection section;
  int limit;
  GetNameFunc local_4a8;
  int local_4a0;
  string local_498;
  allocator<char> local_471;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  GLenum local_3f0;
  undefined1 local_3ec [4];
  deUint32 err_2;
  StateQueryMemoryWriteGuard<int> maxUniformComponents;
  GetNameFunc local_3d0;
  int local_3c8;
  string local_3c0;
  allocator<char> local_399;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  GLenum local_318;
  undefined1 local_314 [4];
  deUint32 err_1;
  StateQueryMemoryWriteGuard<int> maxUniformBlockSize;
  GetNameFunc local_2f8;
  int local_2f0;
  string local_2e8;
  allocator<char> local_2c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  GLenum local_240;
  undefined1 local_23c [4];
  deUint32 err;
  StateQueryMemoryWriteGuard<int> maxUniformBlocks;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  CombinedGeometryUniformLimitCase *this_local;
  
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar2),pTVar5);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar5,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&maxUniformBlocks.m_value,pTVar5,
             (BeginMessageToken *)&tcu::TestLog::Message);
  this_00 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&maxUniformBlocks.m_value,
                       (char (*) [156])
                       "The minimum value of MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS is MAX_GEOMETRY_UNIFORM_BLOCKS x MAX_UNIFORM_BLOCK_SIZE / 4 + MAX_GEOMETRY_UNIFORM_COMPONENTS"
                      );
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&maxUniformBlocks.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_23c);
  piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_23c);
  glu::CallLogWrapper::glGetIntegerv
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8a2c,piVar6);
  do {
    local_240 = glu::CallLogWrapper::glGetError
                          ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    if (local_240 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c0,"Got Error ",&local_2c1);
      EVar7 = glu::getErrorStr(local_240);
      maxUniformBlockSize._4_8_ = EVar7.m_getName;
      local_2f0 = EVar7.m_value;
      local_2f8 = (GetNameFunc)maxUniformBlockSize._4_8_;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2e8,&local_2f8);
      std::operator+(&local_2a0,&local_2c0,&local_2e8);
      std::operator+(&local_280,&local_2a0,": ");
      std::operator+(&local_260,&local_280,"glGetIntegerv");
      tcu::ResultCollector::fail((ResultCollector *)local_78,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_314);
  piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_314);
  glu::CallLogWrapper::glGetIntegerv
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8a30,piVar6);
  do {
    local_318 = glu::CallLogWrapper::glGetError
                          ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    if (local_318 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"Got Error ",&local_399);
      EVar7 = glu::getErrorStr(local_318);
      maxUniformComponents._4_8_ = EVar7.m_getName;
      local_3c8 = EVar7.m_value;
      local_3d0 = (GetNameFunc)maxUniformComponents._4_8_;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_3c0,&local_3d0);
      std::operator+(&local_378,&local_398,&local_3c0);
      std::operator+(&local_358,&local_378,": ");
      std::operator+(&local_338,&local_358,"glGetIntegerv");
      tcu::ResultCollector::fail((ResultCollector *)local_78,&local_338);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator(&local_399);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_3ec);
  piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_3ec);
  glu::CallLogWrapper::glGetIntegerv
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8ddf,piVar6);
  do {
    local_3f0 = glu::CallLogWrapper::glGetError
                          ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    if (local_3f0 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"Got Error ",&local_471);
      EVar7 = glu::getErrorStr(local_3f0);
      local_4a8 = EVar7.m_getName;
      local_4a0 = EVar7.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_498,&local_4a8);
      std::operator+(&local_450,&local_470,&local_498);
      std::operator+(&local_430,&local_450,": ");
      std::operator+(&local_410,&local_430,"glGetIntegerv");
      tcu::ResultCollector::fail((ResultCollector *)local_78,&local_410);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_498);
      std::__cxx11::string::~string((string *)&local_470);
      std::allocator<char>::~allocator(&local_471);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_23c,(ResultCollector *)local_78);
  if (((bVar1) &&
      (bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                         ((StateQueryMemoryWriteGuard<int> *)local_314,(ResultCollector *)local_78),
      bVar1)) &&
     (bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                        ((StateQueryMemoryWriteGuard<int> *)local_3ec,(ResultCollector *)local_78),
     bVar1)) {
    piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_23c);
    iVar2 = *piVar6;
    piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_314);
    iVar2 = iVar2 * *piVar6;
    if (iVar2 < 0) {
      iVar2 = iVar2 + 3;
    }
    piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_3ec);
    section.m_log._4_4_ = (iVar2 >> 2) + *piVar6;
    deqp::gls::StateQueryUtil::verifyStateIntegerMin
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8a32,section.m_log._4_4_,QUERY_INTEGER);
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"Types",&local_4e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_510,"Alternative queries",&local_511);
    tcu::ScopedLogSection::ScopedLogSection(&local_4c8,pTVar5,&local_4e8,&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator(&local_511);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    deqp::gls::StateQueryUtil::verifyStateIntegerMin
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8a32,section.m_log._4_4_,QUERY_BOOLEAN);
    deqp::gls::StateQueryUtil::verifyStateIntegerMin
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8a32,section.m_log._4_4_,QUERY_INTEGER64);
    deqp::gls::StateQueryUtil::verifyStateIntegerMin
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8a32,section.m_log._4_4_,QUERY_FLOAT);
    tcu::ScopedLogSection::~ScopedLogSection(&local_4c8);
  }
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_78,
             (this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

CombinedGeometryUniformLimitCase::IterateResult CombinedGeometryUniformLimitCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "The minimum value of MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS is MAX_GEOMETRY_UNIFORM_BLOCKS x MAX_UNIFORM_BLOCK_SIZE / 4 + MAX_GEOMETRY_UNIFORM_COMPONENTS"
						<< tcu::TestLog::EndMessage;

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlocks;
	gl.glGetIntegerv(GL_MAX_GEOMETRY_UNIFORM_BLOCKS, &maxUniformBlocks);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlockSize;
	gl.glGetIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &maxUniformBlockSize);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformComponents;
	gl.glGetIntegerv(GL_MAX_GEOMETRY_UNIFORM_COMPONENTS, &maxUniformComponents);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	if (maxUniformBlocks.verifyValidity(result) && maxUniformBlockSize.verifyValidity(result) && maxUniformComponents.verifyValidity(result))
	{
		const int limit = ((int)maxUniformBlocks) * ((int)maxUniformBlockSize) / 4 + (int)maxUniformComponents;
		verifyStateIntegerMin(result, gl, GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS, limit, QUERY_INTEGER);

		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Types", "Alternative queries");
			verifyStateIntegerMin(result, gl, GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS, limit, QUERY_BOOLEAN);
			verifyStateIntegerMin(result, gl, GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS, limit, QUERY_INTEGER64);
			verifyStateIntegerMin(result, gl, GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS, limit, QUERY_FLOAT);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}